

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

EC_POINT * x9_62_decode_point(EC_GROUP *group,ptls_iovec_t vec,BN_CTX *bn_ctx)

{
  int iVar1;
  EC_POINT *point;
  BN_CTX *bn_ctx_local;
  EC_GROUP *group_local;
  ptls_iovec_t vec_local;
  
  vec_local.len = (size_t)EC_POINT_new((EC_GROUP *)group);
  if ((EC_POINT *)vec_local.len == (EC_POINT *)0x0) {
    vec_local.len = 0;
  }
  else {
    iVar1 = EC_POINT_oct2point((EC_GROUP *)group,(EC_POINT *)vec_local.len,vec.base,vec.len,
                               (BN_CTX *)bn_ctx);
    if (iVar1 == 0) {
      EC_POINT_free((EC_POINT *)vec_local.len);
      vec_local.len = 0;
    }
  }
  return (EC_POINT *)vec_local.len;
}

Assistant:

static EC_POINT *x9_62_decode_point(EC_GROUP *group, ptls_iovec_t vec, BN_CTX *bn_ctx)
{
    EC_POINT *point = NULL;

    if ((point = EC_POINT_new(group)) == NULL)
        return NULL;
    if (!EC_POINT_oct2point(group, point, vec.base, vec.len, bn_ctx)) {
        EC_POINT_free(point);
        return NULL;
    }

    return point;
}